

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  JsonNode *pJVar3;
  ulong uVar4;
  JsonParse x;
  
  if (0 < argc) {
    puVar2 = sqlite3_value_text(*argv);
    iVar1 = jsonParse(&x,ctx,(char *)puVar2);
    if (iVar1 == 0) {
      for (uVar4 = 1; (uint)argc != uVar4; uVar4 = uVar4 + 1) {
        puVar2 = sqlite3_value_text(argv[uVar4]);
        if ((puVar2 == (uchar *)0x0) ||
           (pJVar3 = jsonLookup(&x,(char *)puVar2,(int *)0x0,ctx), x.nErr != '\0'))
        goto LAB_001be336;
        if (pJVar3 != (JsonNode *)0x0) {
          pJVar3->jnFlags = pJVar3->jnFlags | 4;
        }
      }
      if (((x.aNode)->jnFlags & 4) == 0) {
        jsonReturnJson(x.aNode,ctx,(sqlite3_value **)0x0);
      }
LAB_001be336:
      jsonParseReset(&x);
    }
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;

  if( argc<1 ) return;
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ) goto remove_done;
    pNode = jsonLookup(&x, zPath, 0, ctx);
    if( x.nErr ) goto remove_done;
    if( pNode ) pNode->jnFlags |= JNODE_REMOVE;
  }
  if( (x.aNode[0].jnFlags & JNODE_REMOVE)==0 ){
    jsonReturnJson(x.aNode, ctx, 0);
  }
remove_done:
  jsonParseReset(&x);
}